

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O1

string * __thiscall
t_perl_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_perl_generator *this,t_field *tfield,bool init,bool obj)

{
  int iVar1;
  t_type *ptVar2;
  long *plVar3;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long *plVar4;
  size_type *psVar5;
  t_base_type *this_00;
  undefined1 auVar6 [12];
  string result;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  std::operator+(&local_b0,"my $",&tfield->name_);
  if ((int)CONCAT71(in_register_00000009,init) != 0) {
    ptVar2 = t_type::get_true_type(tfield->type_);
    iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])(ptVar2);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])(ptVar2);
      if (((char)iVar1 == '\0') &&
         (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xd])(ptVar2), (char)iVar1 == '\0')) {
        iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xb])(ptVar2);
        if (((char)iVar1 == '\0') &&
           (iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[0xc])(ptVar2), (char)iVar1 == '\0'))
        goto switchD_002f3af4_caseD_0;
        if (obj) {
          perl_namespace_abi_cxx11_(&local_50,this,ptVar2->program_);
          plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x385a2d);
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_80 = *plVar4;
            uStack_78 = (undefined4)plVar3[3];
            uStack_74 = *(undefined4 *)((long)plVar3 + 0x1c);
            local_90 = &local_80;
          }
          else {
            local_80 = *plVar4;
            local_90 = (long *)*plVar3;
          }
          local_88 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          iVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[3])(ptVar2);
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_90,*(ulong *)CONCAT44(extraout_var,iVar1));
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_60 = *plVar4;
            lStack_58 = plVar3[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar4;
            local_70 = (long *)*plVar3;
          }
          local_68 = plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_d0.field_2._M_allocated_capacity = *psVar5;
            local_d0.field_2._8_8_ = plVar3[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar5;
            local_d0._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_d0._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          if (local_90 != &local_80) {
            operator_delete(local_90);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          goto switchD_002f3af4_caseD_0;
        }
      }
      std::__cxx11::string::append((char *)&local_b0);
    }
    else {
      this_00 = (t_base_type *)(ulong)*(uint *)&ptVar2[1].super_t_doc._vptr_t_doc;
      switch(this_00) {
      case (t_base_type *)0x0:
        goto switchD_002f3af4_caseD_0;
      case (t_base_type *)0x1:
        break;
      case (t_base_type *)0x2:
      case (t_base_type *)0x3:
      case (t_base_type *)0x4:
      case (t_base_type *)0x5:
      case (t_base_type *)0x6:
        break;
      case (t_base_type *)0x7:
        break;
      default:
        auVar6 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_d0,this_00,auVar6._8_4_);
        std::operator+(auVar6._0_8_,"compiler error: no PERL initializer for base type ",&local_d0);
        __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::__cxx11::string::append((char *)&local_b0);
    }
  }
switchD_002f3af4_caseD_0:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_b0._M_dataplus._M_p,
             local_b0._M_dataplus._M_p + local_b0._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_perl_generator::declare_field(t_field* tfield, bool init, bool obj) {
  string result = "my $" + tfield->get_name();
  if (init) {
    t_type* type = get_true_type(tfield->get_type());
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        break;
      case t_base_type::TYPE_STRING:
        result += " = ''";
        break;
      case t_base_type::TYPE_BOOL:
        result += " = 0";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = 0.0";
        break;
      default:
        throw "compiler error: no PERL initializer for base type "
            + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      result += " = 0";
    } else if (type->is_container()) {
      result += " = []";
    } else if (type->is_struct() || type->is_xception()) {
      if (obj) {
        result += " = " + perl_namespace(type->get_program()) + type->get_name() + "->new()";
      } else {
        result += " = undef";
      }
    }
  }
  return result + ";";
}